

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configFileReader.cpp
# Opt level: O0

void __thiscall configFileReader::openFile(configFileReader *this)

{
  ifstream *piVar1;
  _Ios_Openmode _Var2;
  ifstream *this_00;
  configFileReader *this_local;
  
  if ((this->isOpen & 1U) == 0) {
    this_00 = (ifstream *)operator_new(0x208);
    std::ifstream::ifstream(this_00);
    this->configFile = (ifstream *)this_00;
    piVar1 = this->configFile;
    _Var2 = std::__cxx11::string::c_str();
    std::ifstream::open((char *)piVar1,_Var2);
    this->isOpen = true;
  }
  return;
}

Assistant:

void configFileReader::openFile() {
    if (!isOpen) {
        configFile = new ifstream();
        configFile->open(fileName.c_str(), std::ifstream::in);
        isOpen = true;
    }
}